

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

BUFFER_HANDLE BUFFER_create(uchar *source,size_t size)

{
  int iVar1;
  BUFFER *handleptr;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  
  if (source == (uchar *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar3 = "invalid parameter source: %p";
      iVar1 = 0x3e;
LAB_0015b30e:
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/buffer.c"
                ,"BUFFER_create",iVar1,1,pcVar3);
      return (BUFFER_HANDLE)0x0;
    }
  }
  else {
    handleptr = (BUFFER *)calloc(1,0x10);
    if (handleptr == (BUFFER *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar3 = "Failure allocating BUFFER structure";
        iVar1 = 0x49;
        goto LAB_0015b30e;
      }
    }
    else {
      iVar1 = BUFFER_safemalloc(handleptr,size);
      if (iVar1 == 0) {
        memcpy(handleptr->buffer,source,size);
        return handleptr;
      }
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/buffer.c"
                  ,"BUFFER_create",0x50,1,"unable to BUFFER_safemalloc ");
      }
      free(handleptr);
    }
  }
  return (BUFFER_HANDLE)0x0;
}

Assistant:

BUFFER_HANDLE BUFFER_create(const unsigned char* source, size_t size)
{
    BUFFER* result;
    /*Codes_SRS_BUFFER_02_001: [If source is NULL then BUFFER_create shall return NULL.]*/
    if (source == NULL)
    {
        LogError("invalid parameter source: %p", source);
        result = NULL;
    }
    else
    {
        /*Codes_SRS_BUFFER_02_002: [Otherwise, BUFFER_create shall allocate memory to hold size bytes and shall copy from source size bytes into the newly allocated memory.] */
        result = (BUFFER*)calloc(1, sizeof(BUFFER));
        if (result == NULL)
        {
            /*Codes_SRS_BUFFER_02_003: [If allocating memory fails, then BUFFER_create shall return NULL.] */
            /*fallthrough*/
            LogError("Failure allocating BUFFER structure");
        }
        else
        {
            /* Codes_SRS_BUFFER_02_005: [If size parameter is 0 then 1 byte of memory shall be allocated yet size of the buffer shall be set to 0.]*/
            if (BUFFER_safemalloc(result, size) != 0)
            {
                LogError("unable to BUFFER_safemalloc ");
                free(result);
                result = NULL;
            }
            else
            {
                /*Codes_SRS_BUFFER_02_004: [Otherwise, BUFFER_create shall return a non-NULL handle.] */
                (void)memcpy(result->buffer, source, size);
            }
        }
    }
    return (BUFFER_HANDLE)result;
}